

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O1

void __thiscall
Js::LineOffsetCache::BuildCache
          (LineOffsetCache *this,Recycler *allocator,LPCUTF8 sourceStartCharacter,
          LPCUTF8 sourceEndCharacter,charcount_t startingCharacterOffset,
          charcount_t startingByteOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar4;
  undefined1 local_70 [8];
  TrackAllocData data;
  LPCUTF8 local_40;
  LPCUTF8 sourceStartCharacter_local;
  charcount_t startingCharacterOffset_local;
  charcount_t startingByteOffset_local;
  
  data.line = startingCharacterOffset;
  local_40 = sourceStartCharacter;
  sourceStartCharacter_local._0_4_ = startingCharacterOffset;
  sourceStartCharacter_local._4_4_ = startingByteOffset;
  if (sourceStartCharacter == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,199,"(sourceStartCharacter)",
                                "The source start character passed in is null.");
    if (!bVar2) goto LAB_0078ce24;
    *puVar3 = 0;
  }
  if (sourceEndCharacter == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,200,"(sourceEndCharacter)",
                                "The source end character passed in is null.");
    if (!bVar2) goto LAB_0078ce24;
    *puVar3 = 0;
  }
  data._36_4_ = startingByteOffset;
  if (sourceEndCharacter < local_40) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xc9,"(sourceStartCharacter <= sourceEndCharacter)",
                                "The source start character should not be beyond the source end character."
                               );
    if (!bVar2) goto LAB_0078ce24;
    *puVar3 = 0;
  }
  if ((this->lineCharacterOffsetCacheList).ptr !=
      (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xca,"(!this->lineCharacterOffsetCacheList)",
                                "The cache is already built.");
    if (!bVar2) {
LAB_0078ce24:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_70 = (undefined1  [8])
             &JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2c39f0e;
  data.filename._0_4_ = 0xcc;
  alloc = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_70);
  pRVar4 = (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)
           new<Memory::Recycler>(0x30,alloc,0x38bbb2);
  (pRVar4->buffer).ptr = (uint *)0x0;
  pRVar4->count = 0;
  pRVar4->alloc = allocator;
  pRVar4->_vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f08d0;
  pRVar4[1]._vptr_ReadOnlyList = (_func_int **)0x400000000;
  Memory::Recycler::WBSetBit((char *)this);
  (this->lineCharacterOffsetCacheList).ptr = pRVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  AddLine(this,allocator,data.line,data._36_4_);
  bVar2 = FindNextLine(&local_40,sourceEndCharacter,(charcount_t *)&sourceStartCharacter_local,
                       (charcount_t *)((long)&sourceStartCharacter_local + 4),0xffffffff);
  if (bVar2) {
    do {
      AddLine(this,allocator,(charcount_t)sourceStartCharacter_local,
              sourceStartCharacter_local._4_4_);
      bVar2 = FindNextLine(&local_40,sourceEndCharacter,(charcount_t *)&sourceStartCharacter_local,
                           (charcount_t *)((long)&sourceStartCharacter_local + 4),0xffffffff);
    } while (bVar2);
  }
  return;
}

Assistant:

void LineOffsetCache::BuildCache(Recycler * allocator, _In_z_ LPCUTF8 sourceStartCharacter,
        _In_z_ LPCUTF8 sourceEndCharacter,
        charcount_t startingCharacterOffset,
        charcount_t startingByteOffset)
    {
        AssertMsg(sourceStartCharacter, "The source start character passed in is null.");
        AssertMsg(sourceEndCharacter, "The source end character passed in is null.");
        AssertMsg(sourceStartCharacter <= sourceEndCharacter, "The source start character should not be beyond the source end character.");
        AssertMsg(!this->lineCharacterOffsetCacheList, "The cache is already built.");

        this->lineCharacterOffsetCacheList = RecyclerNew(allocator, LineOffsetCacheList, allocator);

        // Add the first line in the cache list.
        this->AddLine(allocator, startingCharacterOffset, startingByteOffset);

        while (FindNextLine(sourceStartCharacter, sourceEndCharacter, startingCharacterOffset, startingByteOffset))
        {
            this->AddLine(allocator, startingCharacterOffset, startingByteOffset);
        }

    }